

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O1

void initoptions(void)

{
  nh_option_desc *pnVar1;
  char *pcVar2;
  long lVar3;
  
  iflags.travelcc.x = -1;
  iflags.travelcc.y = -1;
  flags.warntype = 0;
  builtin_strncpy(flags.inv_order,"\f\x05\x02\x03\a\t\n\b\x04\v\x06\r\x0e\x0f\x10",0x10);
  flags.inv_order[0x10] = '\0';
  flags.inv_order[0x11] = '\0';
  fruitadd("slime mold");
  strncpy(pl_fruit,"slime mold",0x20);
  pcVar2 = birth_options->name;
  if (pcVar2 != (char *)0x0) {
    lVar3 = 0x30;
    pnVar1 = birth_options;
    do {
      nh_set_option(pcVar2,pnVar1->value,'\0');
      pcVar2 = *(char **)((long)&birth_options->name + lVar3);
      pnVar1 = (nh_option_desc *)((long)&birth_options->name + lVar3);
      lVar3 = lVar3 + 0x30;
    } while (pcVar2 != (char *)0x0);
  }
  pcVar2 = options->name;
  if (pcVar2 != (char *)0x0) {
    lVar3 = 0x30;
    pnVar1 = options;
    do {
      nh_set_option(pcVar2,pnVar1->value,'\0');
      pcVar2 = *(char **)((long)&options->name + lVar3);
      pnVar1 = (nh_option_desc *)((long)&options->name + lVar3);
      lVar3 = lVar3 + 0x30;
    } while (pcVar2 != (char *)0x0);
  }
  if (active_birth_options == (nh_option_desc *)0x0) {
    active_birth_options = clone_optlist(birth_options);
  }
  else {
    pcVar2 = active_birth_options->name;
    if (pcVar2 != (char *)0x0) {
      lVar3 = 0x30;
      pnVar1 = active_birth_options;
      do {
        nh_set_option(pcVar2,pnVar1->value,'\0');
        pcVar2 = *(char **)((long)&active_birth_options->name + lVar3);
        pnVar1 = (nh_option_desc *)((long)&active_birth_options->name + lVar3);
        lVar3 = lVar3 + 0x30;
      } while (pcVar2 != (char *)0x0);
    }
  }
  return;
}

Assistant:

void initoptions(void)
{
	int i;
	
	iflags.travelcc.x = iflags.travelcc.y = -1;
	flags.warntype = 0L;

	/* init flags.inv_order this way, as setting it via the option
	 * requires a preexisting order */
	memcpy(flags.inv_order, def_inv_order, sizeof flags.inv_order);

	fruitadd(obj_descr[SLIME_MOLD].oc_name);
	strncpy(pl_fruit, obj_descr[SLIME_MOLD].oc_name, PL_FSIZ);

	/* init from option definitions */
	for (i = 0; birth_options[i].name; i++)
	    nh_set_option(birth_options[i].name, birth_options[i].value, FALSE);

	for (i = 0; options[i].name; i++)
	    nh_set_option(options[i].name, options[i].value, FALSE);

	if (!active_birth_options) {
	    /* at this point the user may no longer change their birth options.
	     * active_birth_options will recieve birth option changes made during
	     * log replay, so that we can show the user what birth options the
	     * loaded game was started with */
	    active_birth_options = clone_optlist(birth_options);
	} else {
	    /* the switch to alternate birth options has already happened,
	     * so make sure those settings are active instead. */
	    for (i = 0; active_birth_options[i].name; i++) {
		nh_set_option(active_birth_options[i].name,
			      active_birth_options[i].value, FALSE);
	    }
	}
}